

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void vli_modInv_update(uECC_word_t *uv,uECC_word_t *mod,wordcount_t num_words)

{
  byte *pbVar1;
  uECC_word_t uVar2;
  
  if ((*uv & 1) == 0) {
    uECC_vli_rshift1(uv,num_words);
    return;
  }
  uVar2 = uECC_vli_add(uv,uv,mod,num_words);
  uECC_vli_rshift1(uv,num_words);
  if (uVar2 != 0) {
    pbVar1 = (byte *)((long)uv + (long)num_words * 8 + -1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return;
}

Assistant:

static void vli_modInv_update(uECC_word_t *uv,
                              const uECC_word_t *mod,
                              wordcount_t num_words) {
    uECC_word_t carry = 0;
    if (!EVEN(uv)) {
        carry = uECC_vli_add(uv, uv, mod, num_words);
    }
    uECC_vli_rshift1(uv, num_words);
    if (carry) {
        uv[num_words - 1] |= HIGH_BIT_SET;
    }
}